

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::CheckData(CopyTest *this,GLenum target,GLuint size)

{
  long lVar1;
  ostringstream *this_00;
  long lVar2;
  long lVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  GLubyte *pGVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  string local_1f8;
  string local_1d8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pGVar5 = (GLubyte *)operator_new__((ulong)size);
  this->m_result = pGVar5;
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0xaa0))(target,0,0x1908,0x1401,pGVar5);
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x157c);
  bVar8 = size == 0;
  if (!bVar8) {
    if (*this->m_result == '\0') {
      lVar6 = 0;
      do {
        if (size - 1 == (int)lVar6) {
          return true;
        }
        lVar2 = lVar6 + 1;
        lVar1 = lVar6 + 1;
        lVar3 = lVar6 + 1;
        lVar6 = lVar1;
      } while (s_texture_data[lVar2] == this->m_result[lVar3]);
      bVar8 = size <= (uint)lVar1;
    }
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar7 = "glCopyTextureSubImage*D created texture with data ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glCopyTextureSubImage*D created texture with data ",0x32);
    DataToString_abi_cxx11_(&local_1d8,(CopyTest *)pcVar7,size,s_texture_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    pcVar7 = " however texture contains data ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," however texture contains data ",0x1f);
    DataToString_abi_cxx11_(&local_1f8,(CopyTest *)pcVar7,size,this->m_result);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,". Texture target was ",0x15);
    local_1b8.m_getName = glu::getTextureTargetName;
    local_1b8.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Test fails.",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  return bVar8;
}

Assistant:

bool CopyTest::CheckData(glw::GLenum target, glw::GLuint size)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check texture content with reference. */
	m_result = new glw::GLubyte[size];

	if (DE_NULL == m_result)
	{
		throw 0;
	}

	gl.getTexImage(target, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	for (glw::GLuint i = 0; i < size; ++i)
	{
		if (s_texture_data[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCopyTextureSubImage*D created texture with data "
				<< DataToString(size, s_texture_data) << " however texture contains data "
				<< DataToString(size, m_result) << ". Texture target was " << glu::getTextureTargetStr(target)
				<< ". Test fails." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}